

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# player-util.c
# Opt level: O2

_Bool player_can_study(player *p,_Bool show_msg)

{
  _Bool _Var1;
  magic_realm *pmVar2;
  magic_realm *p_00;
  char *src;
  wchar_t count;
  char buf [120];
  
  _Var1 = player_can_cast(p,show_msg);
  if (_Var1) {
    _Var1 = p->upkeep->new_spells != L'\0';
    if (show_msg && !_Var1) {
      pmVar2 = class_magic_realms(p->class,&count);
      my_strcpy(buf,pmVar2->spell_noun,0x78);
      my_strcat(buf,"s",0x78);
      p_00 = pmVar2->next;
      mem_free(pmVar2);
      if (p_00 != (magic_realm *)0x0 && L'\x01' < count) {
        do {
          count = count + L'\xffffffff';
          src = " or ";
          if (count != L'\0') {
            src = ", ";
          }
          my_strcat(buf,src,0x78);
          my_strcat(buf,p_00->spell_noun,0x78);
          my_strcat(buf,"s",0x78);
          pmVar2 = p_00->next;
          mem_free(p_00);
          p_00 = pmVar2;
        } while (pmVar2 != (magic_realm *)0x0);
      }
      _Var1 = false;
      msg("You cannot learn any new %s!",buf);
    }
  }
  else {
    _Var1 = false;
  }
  return _Var1;
}

Assistant:

bool player_can_study(const struct player *p, bool show_msg)
{
	if (!player_can_cast(p, show_msg))
		return false;

	if (!p->upkeep->new_spells) {
		if (show_msg) {
			int count;
			struct magic_realm *r = class_magic_realms(p->class, &count), *r1;
			char buf[120];

			my_strcpy(buf, r->spell_noun, sizeof(buf));
			my_strcat(buf, "s", sizeof(buf));
			r1 = r->next;
			mem_free(r);
			r = r1;
			if (count > 1) {
				while (r) {
					count--;
					if (count) {
						my_strcat(buf, ", ", sizeof(buf));
					} else {
						my_strcat(buf, " or ", sizeof(buf));
					}
					my_strcat(buf, r->spell_noun, sizeof(buf));
					my_strcat(buf, "s", sizeof(buf));
					r1 = r->next;
					mem_free(r);
					r = r1;
				}
			}
			msg("You cannot learn any new %s!", buf);
		}
		return false;
	}

	return true;
}